

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf,string *target)

{
  char *pcVar1;
  allocator local_61;
  string message;
  string depname;
  
  std::__cxx11::string::string((string *)&depname,(string *)target);
  std::__cxx11::string::append((char *)&depname);
  if (this->RecordDependencies == true) {
    cmMakefile::AddCacheDefinition(mf,&depname,"","Dependencies for target",STATIC,false);
  }
  else {
    pcVar1 = cmMakefile::GetDefinition(mf,&depname);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::string((string *)&message,"Target ",&local_61);
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::append((char *)&message);
      std::__cxx11::string::append((char *)&message);
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::append((char *)&message);
      cmSystemTools::Error(message._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&message);
    }
  }
  std::__cxx11::string::~string((string *)&depname);
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf,
                                          const std::string& target)
{
  // Clear the dependencies. The cache variable must exist iff we are
  // recording dependency information for this target.
  std::string depname = target;
  depname += "_LIB_DEPENDS";
  if (this->RecordDependencies) {
    mf.AddCacheDefinition(depname, "", "Dependencies for target",
                          cmStateEnums::STATIC);
  } else {
    if (mf.GetDefinition(depname)) {
      std::string message = "Target ";
      message += target;
      message += " has dependency information when it shouldn't.\n";
      message += "Your cache is probably stale. Please remove the entry\n  ";
      message += depname;
      message += "\nfrom the cache.";
      cmSystemTools::Error(message.c_str());
    }
  }
}